

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall CCharmapToLocal::load_table(CCharmapToLocal *this,osfildef *fp)

{
  uint3 uVar1;
  ushort uVar2;
  byte bVar3;
  long lVar4;
  size_t sVar5;
  uchar *puVar6;
  wchar_t *pwVar7;
  uint uVar8;
  ulong uVar9;
  uint xlat_offset;
  uchar buf [256];
  uint local_13c;
  ushort local_138;
  byte bStack_136;
  undefined1 uStack_135;
  undefined2 uStack_134;
  
  lVar4 = ftell((FILE *)fp);
  sVar5 = fread(&local_138,4,1,(FILE *)fp);
  if (sVar5 == 1) {
    fseek((FILE *)fp,lVar4 + (ulong)CONCAT13(uStack_135,CONCAT12(bStack_136,local_138)),0);
    sVar5 = fread(&local_138,6,1,(FILE *)fp);
    uVar2 = local_138;
    if (sVar5 == 1) {
      uVar8 = (uint)local_138;
      puVar6 = (uchar *)malloc((ulong)CONCAT22(uStack_134,CONCAT11(uStack_135,bStack_136)));
      this->xlat_array_ = puVar6;
      if (puVar6 != (uchar *)0x0) {
        if (uVar2 != 0) {
          xlat_offset = 0;
          do {
            sVar5 = fread(&local_138,3,1,(FILE *)fp);
            bVar3 = bStack_136;
            if (sVar5 != 1) {
              return;
            }
            uVar9 = (ulong)bStack_136;
            set_mapping(this,(uint)local_138,xlat_offset);
            this->xlat_array_[xlat_offset] = bVar3;
            sVar5 = fread(this->xlat_array_ + (xlat_offset + 1),uVar9,1,(FILE *)fp);
            if (sVar5 != 1) {
              return;
            }
            xlat_offset = xlat_offset + 1 + (uint)bVar3;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        sVar5 = fread(&local_138,6,1,(FILE *)fp);
        uVar2 = local_138;
        uVar1 = CONCAT12(bStack_136,local_138);
        if (CONCAT13(uStack_135,uVar1) != 0x464f4524 && sVar5 == 1) {
          pwVar7 = (wchar_t *)
                   malloc(((ulong)(uVar1 & 0xffff) +
                          (ulong)CONCAT22(uStack_134,CONCAT11(uStack_135,bStack_136))) * 4 + 4);
          this->exp_array_ = pwVar7;
          if ((pwVar7 != (wchar_t *)0x0) && (uVar2 != 0)) {
            local_13c = uVar1 & 0xffff;
            uVar8 = 1;
            while (sVar5 = fread(&local_138,3,1,(FILE *)fp), bVar3 = bStack_136, sVar5 == 1) {
              uVar9 = (ulong)bStack_136;
              set_exp_mapping(this,(uint)local_138,uVar8);
              this->exp_array_[uVar8] = (uint)bVar3;
              for (; uVar8 = uVar8 + 1, uVar9 != 0; uVar9 = uVar9 - 1) {
                sVar5 = fread(&local_138,2,1,(FILE *)fp);
                if (sVar5 != 1) {
                  return;
                }
                this->exp_array_[uVar8] = (uint)local_138;
              }
              local_13c = local_13c - 1;
              if (local_13c == 0) {
                return;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CCharmapToLocal::load_table(osfildef *fp)
{
    ulong startpos;
    ulong ofs;
    uchar buf[256];
    uint cnt;
    ulong xbytes;
    ulong xchars;
    uint next_ofs;
    
    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the first entry, which gives the offset of the to-local table */
    if (osfrb(fp, buf, 4))
        return;
    ofs = t3rp4u(buf);

    /* seek to the to-local table */
    osfseek(fp, startpos + ofs, OSFSK_SET);

    /* read the number of entries and number of bytes needed */
    if (osfrb(fp, buf, 6))
        return;
    cnt = osrp2(buf);
    xbytes = t3rp4u(buf + 2);

    /* 
     *   Allocate space for the translation table.  Note that we cannot
     *   handle translation tables bigger than the maximum allowed in a
     *   single allocation unit on the operating system. 
     */
    if (xbytes > OSMALMAX)
        return;
    xlat_array_ = (unsigned char *)t3malloc(xbytes);
    if (xlat_array_ == 0)
        return;

    /*
     *   Read each mapping 
     */
    for (next_ofs = 0 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        
        /* read the code point and translation length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and translation length */
        codept = osrp2(buf);
        xlen = (unsigned int)buf[2];

        /* assign the mapping */
        set_mapping(codept, next_ofs);

        /* store the translation length */
        xlat_array_[next_ofs++] = buf[2];

        /* read the translation bytes */
        if (osfrb(fp, xlat_array_ + next_ofs, xlen))
            return;

        /* skip past the translation bytes we've read */
        next_ofs += xlen;
    }

    /*
     *   Next, read the expansions, if present.
     *   
     *   If we find the $EOF marker, it means it's an old-format file without
     *   the separate expansion definitions.  Otherwise, we'll have the
     *   expansion entry count and the aggregate number of unicode characters
     *   in all of the expansions.  
     */
    if (osfrb(fp, buf, 6) || memcmp(buf, "$EOF", 4) == 0)
        return;

    /* decode the expansion entry count and aggregate length */
    cnt = osrp2(buf);
    xchars = t3rp4u(buf + 2);

    /* 
     *   add one entry so that we can leave index zero unused, to indicate
     *   unmapped characters 
     */
    ++xchars;

    /* add one array slot per entry, for the length prefix slots */
    xchars += cnt;

    /* allocate space for the expansions */
    exp_array_ = (wchar_t *)t3malloc(xchars * sizeof(wchar_t));
    if (exp_array_ == 0)
        return;

    /* 
     *   read the mappings; start loading them at index 1, since we want to
     *   leave index 0 unused so that it can indicate unused mappings 
     */
    for (next_ofs = 1 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        size_t i;

        /* read this entry's unicode value and expansion character length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and expansion length */
        codept = osrp2(buf);
        xlen = (uint)buf[2];

        /* assign the expansion mapping */
        set_exp_mapping(codept, next_ofs);

        /* set the length prefix */
        exp_array_[next_ofs++] = (wchar_t)xlen;

        /* read and store the expansion characters */
        for (i = 0 ; i < xlen ; ++i)
        {
            /* read this translation */
            if (osfrb(fp, buf, 2))
                return;

            /* decode and store this translation */
            exp_array_[next_ofs++] = osrp2(buf);
        }
    }
}